

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_protocol_handle_verify_connect
              (ENetHost *host,ENetEvent *event,ENetPeer *peer,ENetProtocol *command)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if (peer->state == ENET_PEER_STATE_CONNECTING) {
    uVar3 = (command->connect).channelCount;
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    if ((((uVar3 - 0x100 < 0xffffff01) ||
         (uVar1 = (command->connect).packetThrottleInterval,
         (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) !=
         peer->packetThrottleInterval)) ||
        (uVar1 = (command->connect).packetThrottleAcceleration,
        (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) !=
        peer->packetThrottleAcceleration)) ||
       ((uVar1 = (command->connect).packetThrottleDeceleration,
        (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) !=
        peer->packetThrottleDeceleration || ((command->connect).connectID != peer->connectID)))) {
      peer->eventData = 0;
      enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
      iVar2 = -1;
    }
    else {
      enet_protocol_remove_sent_reliable_command(peer,1,0xff);
      if ((ulong)uVar3 < peer->channelCount) {
        peer->channelCount = (ulong)uVar3;
      }
      peer->outgoingPeerID =
           (command->acknowledge).receivedReliableSequenceNumber << 8 |
           (command->acknowledge).receivedReliableSequenceNumber >> 8;
      peer->incomingSessionID = (command->connect).incomingSessionID;
      peer->outgoingSessionID = (command->connect).outgoingSessionID;
      uVar3 = (command->connect).mtu;
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if (0xfff < uVar3) {
        uVar3 = 0x1000;
      }
      uVar1 = 0x240;
      if (0x240 < uVar3) {
        uVar1 = uVar3;
      }
      if (uVar1 < peer->mtu) {
        peer->mtu = uVar1;
      }
      uVar3 = (command->connect).windowSize;
      uVar1 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = 0x1000;
      if (0x1000 < uVar1) {
        uVar3 = uVar1;
      }
      if (0xffff < uVar3) {
        uVar3 = 0x10000;
      }
      if (uVar3 < peer->windowSize) {
        peer->windowSize = uVar3;
      }
      uVar3 = (command->connect).incomingBandwidth;
      peer->incomingBandwidth =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = (command->connect).outgoingBandwidth;
      peer->outgoingBandwidth =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      enet_protocol_notify_connect(host,peer,event);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int enet_protocol_handle_verify_connect(ENetHost *host, ENetEvent *event, ENetPeer *peer, const ENetProtocol *command) {
        enet_uint32 mtu, windowSize;
        size_t channelCount;

        if (peer->state != ENET_PEER_STATE_CONNECTING) {
            return 0;
        }

        channelCount = ENET_NET_TO_HOST_32(command->verifyConnect.channelCount);

        if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT || channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT ||
            ENET_NET_TO_HOST_32(command->verifyConnect.packetThrottleInterval) != peer->packetThrottleInterval ||
            ENET_NET_TO_HOST_32(command->verifyConnect.packetThrottleAcceleration) != peer->packetThrottleAcceleration ||
            ENET_NET_TO_HOST_32(command->verifyConnect.packetThrottleDeceleration) != peer->packetThrottleDeceleration ||
            command->verifyConnect.connectID != peer->connectID
        ) {
            peer->eventData = 0;
            enet_protocol_dispatch_state(host, peer, ENET_PEER_STATE_ZOMBIE);
            return -1;
        }

        enet_protocol_remove_sent_reliable_command(peer, 1, 0xFF);

        if (channelCount < peer->channelCount) {
            peer->channelCount = channelCount;
        }

        peer->outgoingPeerID    = ENET_NET_TO_HOST_16(command->verifyConnect.outgoingPeerID);
        peer->incomingSessionID = command->verifyConnect.incomingSessionID;
        peer->outgoingSessionID = command->verifyConnect.outgoingSessionID;

        mtu = ENET_NET_TO_HOST_32(command->verifyConnect.mtu);

        if (mtu < ENET_PROTOCOL_MINIMUM_MTU) {
            mtu = ENET_PROTOCOL_MINIMUM_MTU;
        } else if (mtu > ENET_PROTOCOL_MAXIMUM_MTU) {
            mtu = ENET_PROTOCOL_MAXIMUM_MTU;
        }

        if (mtu < peer->mtu) {
            peer->mtu = mtu;
        }

        windowSize = ENET_NET_TO_HOST_32(command->verifyConnect.windowSize);
        if (windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
        }

        if (windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE) {
            windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
        }

        if (windowSize < peer->windowSize) {
            peer->windowSize = windowSize;
        }

        peer->incomingBandwidth = ENET_NET_TO_HOST_32(command->verifyConnect.incomingBandwidth);
        peer->outgoingBandwidth = ENET_NET_TO_HOST_32(command->verifyConnect.outgoingBandwidth);

        enet_protocol_notify_connect(host, peer, event);
        return 0;
    }